

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldMessageAccessor::Swap
          (RepeatedPtrFieldMessageAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  Nullable<const_char_*> failure_msg;
  RepeatedPtrField<google::protobuf::Message> *this_00;
  RepeatedPtrField<google::protobuf::Message> *other;
  RepeatedPtrFieldMessageAccessor *local_30 [2];
  RepeatedFieldAccessor *local_20;
  
  local_30[0] = this;
  local_20 = other_mutator;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::RepeatedPtrFieldMessageAccessor_const*,google::protobuf::internal::RepeatedFieldAccessor_const*>
                          (local_30,&local_20,"this == other_mutator");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    this_00 = (RepeatedPtrField<google::protobuf::Message> *)
              (**(code **)((long)*this + 0x88))(this,data);
    other = (RepeatedPtrField<google::protobuf::Message> *)
            (**(code **)((long)*this + 0x88))(this,other_data);
    RepeatedPtrField<google::protobuf::Message>::Swap(this_00,other);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_internal.h"
             ,0x113,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_30);
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    ABSL_CHECK_EQ(this, other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }